

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matte.cpp
# Opt level: O2

MatteMaterial * phyr::createMatteMaterial(double Kd,double sigma)

{
  MatteMaterial *this;
  undefined1 local_228 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_210 [2];
  double sigma_local;
  CoefficientSpectrum<60> local_1f8;
  
  sigma_local = sigma;
  CoefficientSpectrum<60>::CoefficientSpectrum(&local_1f8,Kd);
  std::make_shared<phyr::ConstantTexture<phyr::SampledSpectrum>,phyr::SampledSpectrum>
            ((SampledSpectrum *)local_228);
  local_228._16_8_ = local_228._0_8_;
  a_Stack_210[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
  local_228._0_8_ = 0.0;
  local_228._8_8_ = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
  std::make_shared<phyr::ConstantTexture<double>,double&>((double *)local_228);
  local_1f8.samples[0] = (double)local_228._0_8_;
  local_1f8.samples[1] = (double)local_228._8_8_;
  local_228._0_8_ = 0.0;
  local_228._8_8_ = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
  this = (MatteMaterial *)operator_new(0x28);
  MatteMaterial::MatteMaterial
            (this,(shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)(local_228 + 0x10),
             (shared_ptr<phyr::Texture<double>_> *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8.samples + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_210);
  return this;
}

Assistant:

MatteMaterial* createMatteMaterial(Real Kd, Real sigma) {
    std::shared_ptr<Texture<Spectrum>> kd =
            std::make_shared<ConstantTexture<Spectrum>>(Spectrum(Kd));
    std::shared_ptr<Texture<Real>> _sigma =
            std::make_shared<ConstantTexture<Real>>(sigma);

    return new MatteMaterial(kd, _sigma);
}